

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_tas(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  pTVar1 = gen_ea(env,s,insn,0,tcg_ctx->NULL_QREG,&addr,EA_LOADS,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    gen_logic_cc(s,pTVar1,0);
    tcg_gen_ori_i32_m68k(tcg_ctx,ret,pTVar1,0x80);
    pTVar1 = gen_ea(env,s,insn,0,ret,&addr,EA_STORE,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0))
    ;
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(tas)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv dest;
    TCGv src1;
    TCGv addr;

    dest = tcg_temp_new(tcg_ctx);
    SRC_EA(env, src1, OS_BYTE, 1, &addr);
    gen_logic_cc(s, src1, OS_BYTE);
    tcg_gen_ori_i32(tcg_ctx, dest, src1, 0x80);
    DEST_EA(env, insn, OS_BYTE, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}